

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_vector.h
# Opt level: O3

void crnlib::vector<crnlib::find_files::file_desc>::object_mover
               (void *pDst_void,void *pSrc_void,uint num)

{
  file_desc *pfVar1;
  dynamic_string *this;
  
  if (num != 0) {
    pfVar1 = (file_desc *)((long)pSrc_void + (ulong)num * 0x48);
    this = (dynamic_string *)((long)pDst_void + 0x20);
    do {
      dynamic_string::dynamic_string(this + -2,(dynamic_string *)pSrc_void);
      dynamic_string::dynamic_string(this + -1,&((file_desc *)pSrc_void)->m_base);
      dynamic_string::dynamic_string(this,&((file_desc *)pSrc_void)->m_rel);
      dynamic_string::dynamic_string(this + 1,&((file_desc *)pSrc_void)->m_name);
      *(bool *)&this[2].m_buf_size = ((file_desc *)pSrc_void)->m_is_dir;
      find_files::file_desc::~file_desc((file_desc *)pSrc_void);
      this = (dynamic_string *)&this[4].m_pStr;
      pSrc_void = (void *)((long)pSrc_void + 0x48);
    } while ((file_desc *)pSrc_void != pfVar1);
  }
  return;
}

Assistant:

static void object_mover(void* pDst_void, void* pSrc_void, uint num)
        {
            T* pSrc = static_cast<T*>(pSrc_void);
            T* const pSrc_end = pSrc + num;
            T* pDst = static_cast<T*>(pDst_void);

            while (pSrc != pSrc_end)
            {
                // placement new
                new (static_cast<void*>(pDst)) T(*pSrc);
                pSrc->~T();
                ++pSrc;
                ++pDst;
            }
        }